

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O0

SDL_Surface * gpu_copy_raw_surface_data(uchar *data,int width,int height,int channels)

{
  Uint8 UVar1;
  Uint8 local_448 [8];
  SDL_Color colors [256];
  SDL_Surface *result;
  Uint32 Amask;
  Uint32 Bmask;
  Uint32 Gmask;
  Uint32 Rmask;
  int i;
  int channels_local;
  int height_local;
  int width_local;
  uchar *data_local;
  
  result._0_4_ = 0;
  if (data == (uchar *)0x0) {
    GPU_PushErrorCode("gpu_copy_raw_surface_data",GPU_ERROR_DATA_ERROR,"Got NULL data");
    data_local = (uchar *)0x0;
  }
  else {
    switch(channels) {
    case 1:
      result._4_4_ = 0;
      Amask = 0;
      Bmask = 0;
      break;
    case 2:
      result._4_4_ = 0;
      Amask = 0;
      Bmask = 0;
      break;
    case 3:
      Bmask = 0xff;
      Amask = 0xff00;
      result._4_4_ = 0xff0000;
      break;
    case 4:
      Bmask = 0xff;
      Amask = 0xff00;
      result._4_4_ = 0xff0000;
      result._0_4_ = 0xff000000;
      break;
    default:
      GPU_PushErrorCode("gpu_copy_raw_surface_data",GPU_ERROR_DATA_ERROR,
                        "Invalid number of channels: %d",(ulong)(uint)channels);
      return (SDL_Surface *)0x0;
    }
    data_local = (uchar *)SDL_CreateRGBSurface
                                    (0,width,height,channels << 3,Bmask,Amask,result._4_4_,
                                     result._0_4_);
    if (data_local == (uchar *)0x0) {
      GPU_PushErrorCode("gpu_copy_raw_surface_data",GPU_ERROR_DATA_ERROR,
                        "Failed to create new %dx%d surface",(ulong)(uint)width,(ulong)(uint)height)
      ;
      data_local = (uchar *)0x0;
    }
    else {
      for (Gmask = 0; (int)Gmask < height; Gmask = Gmask + 1) {
        memcpy((void *)(*(long *)(data_local + 0x20) +
                       (long)(int)(Gmask * *(int *)(data_local + 0x18))),
               data + (int)(channels * width * Gmask),(long)(channels * width));
      }
      if ((data_local != (uchar *)0x0) && (*(long *)(*(long *)(data_local + 8) + 8) != 0)) {
        for (Gmask = 0; (int)Gmask < 0x100; Gmask = Gmask + 1) {
          UVar1 = (Uint8)Gmask;
          colors[(long)(int)Gmask + -2].b = UVar1;
          colors[(long)(int)Gmask + -2].g = UVar1;
          colors[(long)(int)Gmask + -2].r = UVar1;
        }
        SDL_SetPaletteColors(*(undefined8 *)(*(long *)(data_local + 8) + 8),local_448,0,0x100);
      }
    }
  }
  return (SDL_Surface *)data_local;
}

Assistant:

static SDL_Surface* gpu_copy_raw_surface_data(unsigned char* data, int width, int height, int channels)
{
    int i;
    Uint32 Rmask, Gmask, Bmask, Amask = 0;
    SDL_Surface* result;
    
    if(data == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Got NULL data");
        return NULL;
    }
    
    switch(channels)
    {
    case 1:
        Rmask = Gmask = Bmask = 0;  // Use default RGB masks for 8-bit
        break;
    case 2:
        Rmask = Gmask = Bmask = 0;  // Use default RGB masks for 16-bit
        break;
    case 3:
        // These are reversed from what SDL_image uses...  That is bad. :(  Needs testing.
#if SDL_BYTEORDER == SDL_BIG_ENDIAN
        Rmask = 0xff0000;
        Gmask = 0x00ff00;
        Bmask = 0x0000ff;
#else
        Rmask = 0x0000ff;
        Gmask = 0x00ff00;
        Bmask = 0xff0000;
#endif
        break;
    case 4:
        Rmask = 0x000000ff;
        Gmask = 0x0000ff00;
        Bmask = 0x00ff0000;
        Amask = 0xff000000;
        break;
    default:
        Rmask = Gmask = Bmask = 0;
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Invalid number of channels: %d", channels);
        return NULL;
        break;
    }

    result = SDL_CreateRGBSurface(SDL_SWSURFACE, width, height, channels*8, Rmask, Gmask, Bmask, Amask);
    if(result == NULL)
    {
        GPU_PushErrorCode(__func__, GPU_ERROR_DATA_ERROR, "Failed to create new %dx%d surface", width, height);
        return NULL;
    }

    // Copy row-by-row in case the pitch doesn't match
    for(i = 0; i < height; ++i)
    {
        memcpy((Uint8*)result->pixels + i*result->pitch, data + channels*width*i, channels*width);
    }
    
    if(result != NULL && result->format->palette != NULL)
    {
        // SDL_CreateRGBSurface has no idea what palette to use, so it uses a blank one.
        // We'll at least create a grayscale one, but it's not ideal...
        // Better would be to get the palette from stbi, but stbi doesn't do that!
        SDL_Color colors[256];

        for(i = 0; i < 256; i++)
        {
            colors[i].r = colors[i].g = colors[i].b = (Uint8)i;
        }

        /* Set palette */
#ifdef SDL_GPU_USE_SDL2
        SDL_SetPaletteColors(result->format->palette, colors, 0, 256);
#else
        SDL_SetPalette(result, SDL_LOGPAL, colors, 0, 256);
#endif
    }
    
    return result;
}